

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::AddSpell(Character *this,short spell)

{
  ESF *pEVar1;
  bool bVar2;
  value_type local_14;
  
  if (((0 < spell) &&
      (pEVar1 = this->world->esf,
      (ulong)(ushort)spell <
      (ulong)(((long)(pEVar1->data).
                     super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar1->data).
                    super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x68))) &&
     (bVar2 = HasSpell(this,spell), !bVar2)) {
    std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::push_back
              (&this->spells,&local_14);
    CheckQuestRules(this);
    return true;
  }
  return false;
}

Assistant:

bool Character::AddSpell(short spell)
{
	if (spell <= 0 || std::size_t(spell) >= this->world->esf->data.size())
		return false;

	if (this->HasSpell(spell))
		return false;

	this->spells.push_back(Character_Spell(spell, 0));

	this->CheckQuestRules();

	return true;
}